

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O0

void __thiscall FIX::Session::reset(Session *this)

{
  allocator<char> local_31;
  string local_30;
  Session *local_10;
  Session *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  generateLogout(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  disconnect(this);
  SessionState::reset(&this->m_state);
  return;
}

Assistant:

void reset() EXCEPT ( IOException )
  { generateLogout(); disconnect(); m_state.reset(); }